

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

void __thiscall
ot::commissioner::JobManager::ErrorMsg(JobManager *this,uint64_t aNid,string *aMessage)

{
  Interpreter *this_00;
  string local_40;
  string *local_20;
  string *aMessage_local;
  uint64_t aNid_local;
  JobManager *this_local;
  
  this_00 = this->mInterpreter;
  local_20 = aMessage;
  aMessage_local = (string *)aNid;
  aNid_local = (uint64_t)this;
  std::__cxx11::string::string((string *)&local_40,(string *)aMessage);
  Interpreter::PrintNetworkMessage(this_00,aNid,&local_40,kRed);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void JobManager::ErrorMsg(uint64_t aNid, std::string aMessage)
{
    mInterpreter.PrintNetworkMessage(aNid, aMessage, Console::Color::kRed);
}